

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O2

void av1_setup_frame_contexts(AV1_COMMON *cm)

{
  long lVar1;
  int i;
  ulong uVar2;
  
  memcpy(cm->default_frame_context,cm->fc,0x52fc);
  if ((cm->tiles).large_scale != 0) {
    for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
      if (((long)cm->remapped_ref_idx[lVar1] != -1) &&
         (cm->ref_frame_map[cm->remapped_ref_idx[lVar1]] != (RefCntBuffer *)0x0)) {
        memcpy(&cm->ref_frame_map[cm->remapped_ref_idx[lVar1]]->frame_context,cm->fc,0x52fc);
      }
    }
    lVar1 = 0x5d8;
    for (uVar2 = 0; uVar2 < cm->buffer_pool->num_frame_bufs; uVar2 = uVar2 + 1) {
      memcpy((void *)((long)cm->buffer_pool->frame_bufs->ref_order_hints + lVar1 + -8),cm->fc,0x52fc
            );
      lVar1 = lVar1 + 0x58e0;
    }
  }
  return;
}

Assistant:

void av1_setup_frame_contexts(AV1_COMMON *cm) {
  // Store the frame context into a special slot (not associated with any
  // reference buffer), so that we can set up cm->pre_fc correctly later
  // This function must ONLY be called when cm->fc has been initialized with
  // default probs, either by av1_setup_past_independence or after manually
  // initializing them
  *cm->default_frame_context = *cm->fc;
  // TODO(jack.haughton@argondesign.com): don't think this should be necessary,
  // but could do with fuller testing
  if (cm->tiles.large_scale) {
    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
      RefCntBuffer *const buf = get_ref_frame_buf(cm, i);
      if (buf != NULL) buf->frame_context = *cm->fc;
    }
    for (int i = 0; i < cm->buffer_pool->num_frame_bufs; ++i)
      cm->buffer_pool->frame_bufs[i].frame_context = *cm->fc;
  }
}